

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O1

qreal QStyleHelper::angle(QPointF *p1,QPointF *p2)

{
  double dVar1;
  bool bVar2;
  QPointF *pQVar3;
  QPointF *pQVar4;
  double dVar5;
  qreal qVar6;
  ulong uVar7;
  
  dVar5 = p1->xp;
  dVar1 = p2->xp;
  if ((dVar5 != dVar1) || (NAN(dVar5) || NAN(dVar1))) {
    bVar2 = dVar1 < dVar5;
    uVar7 = -(ulong)bVar2 & (ulong)dVar1;
    pQVar4 = p2;
    pQVar3 = p1;
    if (dVar1 < dVar5) {
      pQVar4 = p1;
      dVar1 = dVar5;
      pQVar3 = p2;
    }
    dVar5 = atan(-(pQVar4->yp - pQVar3->yp) /
                 (dVar1 - (double)(~-(ulong)bVar2 & (ulong)dVar5 | uVar7)));
    uVar7 = -(ulong)(p1->xp < p2->xp);
    qVar6 = (qreal)(~uVar7 & (ulong)-(dVar5 * 57.29577951308232) |
                   (ulong)(180.0 - dVar5 * 57.29577951308232) & uVar7);
  }
  else {
    qVar6 = *(qreal *)(&DAT_0067e2a0 + (ulong)(p1->yp <= p2->yp && p2->yp != p1->yp) * 8);
  }
  return qVar6;
}

Assistant:

qreal angle(const QPointF &p1, const QPointF &p2)
{
    static const qreal rad_factor = 180 / Q_PI;
    qreal _angle = 0;

    if (p1.x() == p2.x()) {
        if (p1.y() < p2.y())
            _angle = 270;
        else
            _angle = 90;
    } else  {
        qreal x1, x2, y1, y2;

        if (p1.x() <= p2.x()) {
            x1 = p1.x(); y1 = p1.y();
            x2 = p2.x(); y2 = p2.y();
        } else {
            x2 = p1.x(); y2 = p1.y();
            x1 = p2.x(); y1 = p2.y();
        }

        qreal m = -(y2 - y1) / (x2 - x1);
        _angle = qAtan(m) *  rad_factor;

        if (p1.x() < p2.x())
            _angle = 180 - _angle;
        else
            _angle = -_angle;
    }
    return _angle;
}